

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O0

int Abc_ZddCof0(Abc_ZddMan *p,int a,int Var)

{
  int False;
  int True;
  Abc_ZddObj *pAVar1;
  int local_34;
  int r;
  int r1;
  int r0;
  Abc_ZddObj *A;
  int Var_local;
  int a_local;
  Abc_ZddMan *p_local;
  
  p_local._4_4_ = a;
  if (((1 < a) && (pAVar1 = Abc_ZddNode(p,a), (int)(*(uint *)pAVar1 & 0x7fffffff) <= Var)) &&
     (p_local._4_4_ = Abc_ZddCacheLookup(p,a,Var,7), p_local._4_4_ < 0)) {
    if ((int)(*(uint *)pAVar1 & 0x7fffffff) < Var) {
      False = Abc_ZddCof0(p,pAVar1->False,Var);
      True = Abc_ZddCof0(p,pAVar1->True,Var);
      local_34 = Abc_ZddUniqueCreate(p,*(uint *)pAVar1 & 0x7fffffff,True,False);
    }
    else {
      local_34 = Abc_ZddCof0(p,pAVar1->False,Var);
    }
    p_local._4_4_ = Abc_ZddCacheInsert(p,a,Var,7,local_34);
  }
  return p_local._4_4_;
}

Assistant:

int Abc_ZddCof0( Abc_ZddMan * p, int a, int Var )
{
    Abc_ZddObj * A; 
    int r0, r1, r;
    if ( a < 2 ) return a;
    A = Abc_ZddNode( p, a );
    if ( (int)A->Var > Var )
        return a;
    if ( (r = Abc_ZddCacheLookup(p, a, Var, ABC_ZDD_OPER_COF0)) >= 0 )
        return r;
    if ( (int)A->Var < Var )
        r0 = Abc_ZddCof0( p, A->False, Var ),
        r1 = Abc_ZddCof0( p, A->True, Var ),
        r  = Abc_ZddUniqueCreate( p, A->Var, r1, r0 );
    else
        r = Abc_ZddCof0( p, A->False, Var );
    return Abc_ZddCacheInsert( p, a, Var, ABC_ZDD_OPER_COF0, r );
}